

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

GLchar * __thiscall
gl4cts::GPUShaderFP64Test10::getVaryingName(GPUShaderFP64Test10 *this,GLuint result)

{
  TestError *this_00;
  GLuint result_local;
  GPUShaderFP64Test10 *this_local;
  
  if (result == 0) {
    this_local = (GPUShaderFP64Test10 *)anon_var_dwarf_1e58d3;
  }
  else if (result == 1) {
    this_local = (GPUShaderFP64Test10 *)anon_var_dwarf_1e58e0;
  }
  else {
    if (result != 2) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not implemented",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x38d6);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    this_local = (GPUShaderFP64Test10 *)anon_var_dwarf_1e58ed;
  }
  return (GLchar *)this_local;
}

Assistant:

const glw::GLchar* GPUShaderFP64Test10::getVaryingName(glw::GLuint result) const
{
	switch (result)
	{
	case 0:
		return "result_0";
		break;
	case 1:
		return "result_1";
		break;
	case 2:
		return "result_2";
		break;
	default:
		TCU_FAIL("Not implemented");
		return 0;
		break;
	}
}